

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall
StringType::GenDynamicSizeAnyStr(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  Output *in_RSI;
  Env *in_RDI;
  ID *in_stack_ffffffffffffff28;
  StringType *in_stack_ffffffffffffff30;
  Output *in_stack_ffffffffffffff38;
  Expr *in_stack_ffffffffffffff40;
  ID *in_stack_ffffffffffffff50;
  Env *in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 v;
  ID *in_stack_ffffffffffffff98;
  
  v = (undefined1)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  if ((((ulong)in_RDI[5].id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 1) == 0) &&
     ((undefined1  [48])((undefined1  [48])in_RDI[5].id_map._M_t._M_impl & (undefined1  [48])0x1) ==
      (undefined1  [48])0x0)) {
    if (((ulong)in_RDI[5].id_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0x100) ==
        0) {
      if (in_RDI[4].id_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        uVar4 = __cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffff60,(Object *)in_stack_ffffffffffffff58,
                   (string *)in_stack_ffffffffffffff50);
        __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
      }
      string_length_var(in_stack_ffffffffffffff30);
      pcVar1 = Env::LValue((Env *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pcVar2 = Expr::EvalExpr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                              (Env *)in_stack_ffffffffffffff30);
      Output::println(in_RSI,"%s = %s;",pcVar1,pcVar2);
    }
    else {
      string_length_var(in_stack_ffffffffffffff30);
      pcVar1 = Env::LValue((Env *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pcVar2 = Env::RValue(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      pcVar3 = DataPtr::ptr_expr((DataPtr *)0x14ae44);
      Output::println(in_RSI,"%s = (%s) - (%s);",pcVar1,pcVar2,pcVar3);
    }
  }
  else {
    string_length_var(in_stack_ffffffffffffff30);
    pcVar1 = Env::LValue((Env *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff98 =
         (ID *)Env::RValue(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    pcVar2 = DataPtr::ptr_expr((DataPtr *)0x14adae);
    Output::println(in_RSI,"%s = (%s) - (%s);",pcVar1,in_stack_ffffffffffffff98,pcVar2);
    v = (undefined1)((ulong)pcVar1 >> 0x38);
  }
  string_length_var(in_stack_ffffffffffffff30);
  Env::SetEvaluated(in_RDI,in_stack_ffffffffffffff98,(bool)v);
  return;
}

Assistant:

void StringType::GenDynamicSizeAnyStr(Output* out_cc, Env* env, const DataPtr& data)
	{
	ASSERT(type_ == ANYSTR);

	if ( attr_restofdata_ || attr_oneline_ )
		{
		out_cc->println("%s = (%s) - (%s);", env->LValue(string_length_var()),
		                env->RValue(end_of_data), data.ptr_expr());
		}
	else if ( attr_restofflow_ )
		{
		out_cc->println("%s = (%s) - (%s);", env->LValue(string_length_var()),
		                env->RValue(end_of_data), data.ptr_expr());
		}
	else if ( attr_length_expr_ )
		{
		out_cc->println("%s = %s;", env->LValue(string_length_var()),
		                attr_length_expr_->EvalExpr(out_cc, env));
		}
	else
		{
		throw Exception(this, "cannot determine length of bytestring");
		}

	env->SetEvaluated(string_length_var());
	}